

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O0

size_t __thiscall
adios2::format::ChunkV::AddToVec
          (ChunkV *this,size_t size,void *buf,size_t align,bool CopyReqd,MemorySpace MemSpace)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  undefined8 in_RDX;
  ulong in_RSI;
  size_t in_RDI;
  byte in_R8B;
  VecEntry entry_1;
  Chunk c_1;
  size_t NewSize;
  VecEntry *dv;
  char *p;
  size_t alignment;
  size_t actualsize;
  Chunk *c;
  bool AppendPossible;
  VecEntry entry;
  size_t retOffset;
  char *in_stack_ffffffffffffff08;
  ulong uVar4;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff31;
  ChunkV *in_stack_ffffffffffffff38;
  undefined1 local_b0 [24];
  ulong local_98;
  reference local_90;
  undefined4 local_84;
  char *local_80;
  long local_78;
  size_t local_70;
  reference local_68;
  bool local_59;
  undefined1 local_58;
  undefined8 local_50;
  undefined8 local_48;
  ulong local_40;
  size_t local_38;
  byte local_29;
  undefined8 local_20;
  ulong local_18;
  size_t local_8;
  
  local_29 = in_R8B & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  BufferV::AlignBuffer
            ((BufferV *)CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30),in_RDI);
  local_38 = *(size_t *)(in_RDI + 0x70);
  if (local_18 == 0) {
    local_8 = *(size_t *)(in_RDI + 0x70);
  }
  else {
    if (((local_29 & 1) == 0) && ((*(byte *)(in_RDI + 0x50) & 1) == 0)) {
      local_58 = 1;
      local_50 = local_20;
      local_48 = 0;
      local_40 = local_18;
      std::
      vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ::push_back((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff18);
    }
    else {
      sVar1 = std::
              vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
              ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                      *)(in_RDI + 0x58));
      uVar5 = false;
      if (sVar1 != 0) {
        pvVar2 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::back(in_stack_ffffffffffffff10);
        uVar5 = false;
        if ((pvVar2->External & 1U) == 0) {
          in_stack_ffffffffffffff10 =
               (vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                *)(**(long **)(in_RDI + 0xa8) + *(long *)(in_RDI + 0xa0));
          pvVar2 = std::
                   vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ::back(in_stack_ffffffffffffff10);
          in_stack_ffffffffffffff18 = (value_type *)((long)in_stack_ffffffffffffff10 - pvVar2->Size)
          ;
          pvVar2 = std::
                   vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ::back(in_stack_ffffffffffffff10);
          uVar5 = in_stack_ffffffffffffff18 == (value_type *)pvVar2->Base;
        }
      }
      local_59 = (bool)uVar5;
      if (((bool)uVar5 != false) &&
         (*(ulong *)(in_RDI + 0x80) < *(long *)(in_RDI + 0xa0) + local_18)) {
        local_68 = std::
                   vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                   ::back((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                           *)in_stack_ffffffffffffff10);
        local_70 = ChunkAlloc(in_stack_ffffffffffffff38,
                              (Chunk *)CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30)
                              ,in_RDI);
        local_78 = local_70 - *(long *)(in_RDI + 0xa0);
        if (local_78 != 0) {
          local_80 = local_68->Ptr + *(long *)(in_RDI + 0xa0);
          local_84 = 0;
          std::fill<char*,int>
                    ((char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)0xad9c5c);
        }
        local_38 = local_78 + local_38;
        local_90 = std::
                   vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ::back(in_stack_ffffffffffffff10);
        local_90->Size = local_70;
        local_90->Base = local_68->Ptr;
        *(undefined8 *)(in_RDI + 0xa0) = 0;
        *(undefined8 *)(in_RDI + 0xa8) = 0;
        local_59 = false;
      }
      if (local_59 == false) {
        local_98 = *(ulong *)(in_RDI + 0x80);
        if (*(ulong *)(in_RDI + 0x80) < local_18) {
          local_98 = local_18;
        }
        memset(local_b0,0,0x18);
        ChunkAlloc(in_stack_ffffffffffffff38,
                   (Chunk *)CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30),in_RDI);
        std::vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>::
        push_back((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                   *)CONCAT17(uVar5,in_stack_ffffffffffffff20),
                  (value_type *)in_stack_ffffffffffffff18);
        pvVar3 = std::
                 vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                 ::back((vector<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                         *)in_stack_ffffffffffffff10);
        *(reference *)(in_RDI + 0xa8) = pvVar3;
        CopyDataToBuffer((ChunkV *)CONCAT17(uVar5,in_stack_ffffffffffffff20),
                         (size_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         (size_t)in_stack_ffffffffffffff08,Detect);
        *(ulong *)(in_RDI + 0xa0) = local_18;
        std::
        vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
        ::push_back((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                     *)CONCAT17(uVar5,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
      }
      else {
        CopyDataToBuffer((ChunkV *)CONCAT17(uVar5,in_stack_ffffffffffffff20),
                         (size_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                         (size_t)in_stack_ffffffffffffff08,Detect);
        uVar4 = local_18;
        pvVar2 = std::
                 vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 ::back(in_stack_ffffffffffffff10);
        pvVar2->Size = uVar4 + pvVar2->Size;
        *(ulong *)(in_RDI + 0xa0) = local_18 + *(long *)(in_RDI + 0xa0);
      }
    }
    *(size_t *)(in_RDI + 0x70) = local_38 + local_18;
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

size_t ChunkV::AddToVec(const size_t size, const void *buf, size_t align, bool CopyReqd,
                        MemorySpace MemSpace)
{
    AlignBuffer(align); // may call back AddToVec recursively
    size_t retOffset = CurOffset;

    if (size == 0)
    {
        return CurOffset;
    }

    /* std::cout << "  AddToVec: size = " << size << " copy = " << CopyReqd
              << std::endl; */
    if (!CopyReqd && !m_AlwaysCopy)
    {
        /*std::cout << "    add external = " << size << std::endl;*/
        // just add buf to internal version of output vector
        VecEntry entry = {true, buf, 0, size};
        DataV.push_back(entry);
    }
    else
    {
        // we can possibly append this entry to the last if the last was
        // internal
        bool AppendPossible =
            DataV.size() && !DataV.back().External &&
            (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

        if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
        {
            // No room in current chunk, close it out
            // realloc down to used size (helpful?) and set size in array
            /*std::cout << "    downsize ptr = " << m_Chunks.back().Ptr
                      << " to size = " << m_TailChunkPos << std::endl;*/
            Chunk &c = m_Chunks.back();
            size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
            size_t alignment = actualsize - m_TailChunkPos;
            if (alignment)
            {
                auto p = c.Ptr + m_TailChunkPos;
                std::fill(p, p + alignment, 0);
            }
            retOffset += alignment;
            // Update entry in DataV as size and potentiall ptr has changed
            // Learned from sanitizer: downsizing realloc still may change pointer
            VecEntry &dv = DataV.back();
            dv.Size = actualsize;
            dv.Base = c.Ptr;
            m_TailChunkPos = 0;
            m_TailChunk = nullptr;
            AppendPossible = false;
        }
        if (AppendPossible)
        {
            // We can use current chunk, just append the data;
            /*std::cout << "    append to current chunk ptr = "
                      << m_TailChunk->Ptr << " at pos = " << m_TailChunkPos
                      << " add size = " << size << std::endl; */
            CopyDataToBuffer(size, buf, m_TailChunkPos, MemSpace);
            DataV.back().Size += size;
            m_TailChunkPos += size;
        }
        else
        {
            // We need a new chunk, get the larger of size or m_ChunkSize
            /*  std::cout << "    get a new chunk size = " << m_ChunkSize
                      << std::endl; */
            size_t NewSize = m_ChunkSize;
            if (size > m_ChunkSize)
                NewSize = size;
            Chunk c{nullptr, nullptr, 0};
            ChunkAlloc(c, NewSize);
            m_Chunks.push_back(c);
            m_TailChunk = &m_Chunks.back();
            CopyDataToBuffer(size, buf, 0, MemSpace);
            m_TailChunkPos = size;
            VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
            DataV.push_back(entry);
        }
    }
    CurOffset = retOffset + size;
    return retOffset;
}